

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O2

ostream * ninx::parser::element::operator<<(ostream *strm,ASTElement *a)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*a->_vptr_ASTElement[3])(local_30,a,0);
  poVar1 = std::operator<<(strm,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const ASTElement &a) {
                    return strm << a.dump(0);
                }